

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

bool __thiscall QGles2RenderBuffer::create(QGles2RenderBuffer *this)

{
  Format format;
  QRhiGles2 *this_00;
  QSize QVar1;
  QSize QVar2;
  QSize QVar3;
  bool bVar4;
  int iVar5;
  QOpenGLFunctionsPrivate *pQVar6;
  _func_void_GLenum_GLsizei_GLenum_GLsizei_GLsizei **pp_Var7;
  GLchar *pGVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  GLenum local_5c;
  GLenum local_58;
  GLenum local_54;
  GLenum internalFormat;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->renderbuffer != 0) {
    (*(this->super_QRhiRenderBuffer).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  this_00 = (QRhiGles2 *)(this->super_QRhiRenderBuffer).super_QRhiResource.m_rhi;
  iVar5 = QRhiImplementation::effectiveSampleCount
                    ((QRhiImplementation *)this_00,(this->super_QRhiRenderBuffer).m_sampleCount);
  this->samples = iVar5;
  if (((this->super_QRhiRenderBuffer).m_flags.super_QFlagsStorageHelper<QRhiRenderBuffer::Flag,_4>.
       super_QFlagsStorage<QRhiRenderBuffer::Flag>.i & 1) != 0) {
    bVar13 = true;
    if ((this->super_QRhiRenderBuffer).m_type == DepthStencil) goto LAB_004e7044;
    internalFormat = 2;
    local_3c = 0;
    local_4c = 0;
    uStack_44 = 0;
    local_38 = "default";
    QMessageLogger::warning((char *)&internalFormat);
  }
  bVar13 = false;
  bVar4 = QRhiGles2::ensureContext(this_00,(QSurface *)0x0);
  if (!bVar4) goto LAB_004e7044;
  QVar2.wd.m_i = 1;
  QVar2.ht.m_i = 0;
  (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
    [0x4e])(1,&this->renderbuffer);
  (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
    [0x34])(0x8d41,(ulong)this->renderbuffer);
  QVar1 = (this->super_QRhiRenderBuffer).m_pixelSize;
  QVar3 = QVar2;
  if (0 < (this->super_QRhiRenderBuffer).m_pixelSize.ht.m_i &&
      0 < (this->super_QRhiRenderBuffer).m_pixelSize.wd.m_i) {
    QVar2 = QVar1;
    QVar3 = (QSize)((ulong)QVar1 >> 0x20);
  }
  uVar9 = (ulong)QVar2 & 0xffffffff;
  if ((this->super_QRhiRenderBuffer).m_type == DepthStencil) {
    uVar12 = *(uint *)&(this_00->caps).field_0x38;
    if (((uVar12 & 1) == 0) || (this->samples < 2)) {
      if ((uVar12 & 0x6000) != 0) {
        uVar10 = 0x84f9;
        if ((uVar12 >> 0xe & 1) == 0) {
          uVar10 = 0x88f0;
        }
        (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
          functions[0x69])(0x8d41,uVar10,uVar9,QVar3);
        goto LAB_004e6fff;
      }
      bVar13 = (uVar12 & 8) != 0;
      uVar11 = 0x1902;
      if (bVar13) {
        uVar11 = (ulong)(((uVar12 >> 0x13 & 1) != 0) + 0x81a5);
      }
      uVar12 = 0x8d48;
      if (!bVar13) {
        uVar12 = 0x1901;
      }
      (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
        functions[0x69])(0x8d41,uVar11,uVar9,QVar3);
      (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
        functions[0x4e])(1,&this->stencilRenderbuffer);
      (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
        functions[0x34])(0x8d41,(ulong)this->stencilRenderbuffer);
      pQVar6 = (this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
      goto LAB_004e6f1c;
    }
    if (((this_00->caps).field_0x3d & 1) == 0) {
      pp_Var7 = (_func_void_GLenum_GLsizei_GLenum_GLsizei_GLsizei **)
                ((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.
                 functions + 0x18);
    }
    else {
      pp_Var7 = &this_00->glRenderbufferStorageMultisampleEXT;
    }
    (**pp_Var7)(0x8d41,this->samples,0x88f0,QVar2.wd.m_i.m_i,QVar3.wd.m_i.m_i);
LAB_004e6fff:
    this->stencilRenderbuffer = 0;
  }
  else {
    internalFormat = 0x8056;
    uVar12 = *(uint *)&(this_00->caps).field_0x38;
    if ((uVar12 >> 0x14 & 1) != 0) {
      internalFormat = 0x8058;
      format = (this->super_QRhiRenderBuffer).m_backingFormatHint;
      if (format != UnknownFormat) {
        toGlTextureFormat(format,&this_00->caps,&local_54,&internalFormat,&local_58,&local_5c);
      }
    }
    if ((uVar12 & 1) != 0) {
      if (1 < this->samples) {
        (*(this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.
          functions[0x18])(0x8d41,(ulong)(uint)this->samples,(ulong)internalFormat,uVar9,QVar3);
        goto LAB_004e7003;
      }
    }
    pQVar6 = (this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
    uVar12 = internalFormat;
LAB_004e6f1c:
    (*(pQVar6->field_0).functions[0x69])(0x8d41,(ulong)uVar12,uVar9,QVar3);
  }
LAB_004e7003:
  if (this_00->glObjectLabel != (_func_void_GLenum_GLuint_GLsizei_GLchar_ptr *)0x0) {
    pGVar8 = (this->super_QRhiRenderBuffer).super_QRhiResource.m_objectName.d.ptr;
    if (pGVar8 == (GLchar *)0x0) {
      pGVar8 = (GLchar *)&QByteArray::_empty;
    }
    (*this_00->glObjectLabel)(0x8d41,this->renderbuffer,-1,pGVar8);
  }
  this->owns = true;
  this->generation = this->generation + 1;
  QRhiImplementation::registerResource((QRhiImplementation *)this_00,(QRhiResource *)this,true);
  bVar13 = true;
LAB_004e7044:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar13;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2RenderBuffer::create()
{
    if (renderbuffer)
        destroy();

    QRHI_RES_RHI(QRhiGles2);
    samples = rhiD->effectiveSampleCount(m_sampleCount);

    if (m_flags.testFlag(UsedWithSwapChainOnly)) {
        if (m_type == DepthStencil)
            return true;

        qWarning("RenderBuffer: UsedWithSwapChainOnly is meaningless in combination with Color");
    }

    if (!rhiD->ensureContext())
        return false;

    rhiD->f->glGenRenderbuffers(1, &renderbuffer);
    rhiD->f->glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer);

    const QSize size = m_pixelSize.isEmpty() ? QSize(1, 1) : m_pixelSize;

    switch (m_type) {
    case QRhiRenderBuffer::DepthStencil:
        if (rhiD->caps.msaaRenderBuffer && samples > 1) {
            if (rhiD->caps.glesMultisampleRenderToTexture) {
                // Must match the logic in QGles2TextureRenderTarget::create().
                // EXT and non-EXT are not the same thing.
                rhiD->glRenderbufferStorageMultisampleEXT(GL_RENDERBUFFER, samples, GL_DEPTH24_STENCIL8,
                                                          size.width(), size.height());
            } else {
                rhiD->f->glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, GL_DEPTH24_STENCIL8,
                                                          size.width(), size.height());
            }
            stencilRenderbuffer = 0;
        } else if (rhiD->caps.packedDepthStencil || rhiD->caps.needsDepthStencilCombinedAttach) {
            const GLenum storage = rhiD->caps.needsDepthStencilCombinedAttach ? GL_DEPTH_STENCIL : GL_DEPTH24_STENCIL8;
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, storage,
                                           size.width(), size.height());
            stencilRenderbuffer = 0;
        } else {
            GLenum depthStorage = GL_DEPTH_COMPONENT;
            if (rhiD->caps.gles) {
                if (rhiD->caps.depth24)
                    depthStorage = GL_DEPTH_COMPONENT24;
                else
                    depthStorage = GL_DEPTH_COMPONENT16; // plain ES 2.0 only has this
            }
            const GLenum stencilStorage = rhiD->caps.gles ? GL_STENCIL_INDEX8 : GL_STENCIL_INDEX;
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, depthStorage,
                                           size.width(), size.height());
            rhiD->f->glGenRenderbuffers(1, &stencilRenderbuffer);
            rhiD->f->glBindRenderbuffer(GL_RENDERBUFFER, stencilRenderbuffer);
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, stencilStorage,
                                           size.width(), size.height());
        }
        break;
    case QRhiRenderBuffer::Color:
    {
        GLenum internalFormat = GL_RGBA4; // ES 2.0
        if (rhiD->caps.rgba8Format) {
            internalFormat = GL_RGBA8;
            if (m_backingFormatHint != QRhiTexture::UnknownFormat) {
                GLenum glintformat, glformat, gltype;
                // only care about the sized internal format, the rest is not used here
                toGlTextureFormat(m_backingFormatHint, rhiD->caps,
                                  &glintformat, &internalFormat, &glformat, &gltype);
            }
        }
        if (rhiD->caps.msaaRenderBuffer && samples > 1) {
            rhiD->f->glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, internalFormat,
                                                      size.width(), size.height());
        } else {
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, internalFormat,
                                           size.width(), size.height());
        }
    }
        break;
    default:
        Q_UNREACHABLE();
        break;
    }

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_RENDERBUFFER, renderbuffer, -1, m_objectName.constData());

    owns = true;
    generation += 1;
    rhiD->registerResource(this);
    return true;
}